

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

int main(void)

{
  SqStack s;
  undefined4 *__ptr;
  undefined4 *puVar1;
  int iVar2;
  long lVar3;
  undefined4 *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  __ptr = (undefined4 *)malloc(400);
  puVar1 = __ptr;
  iVar2 = 100;
  if (__ptr == (undefined4 *)0x0) {
    printf(anon_var_dwarf_2b);
    puVar1 = in_stack_ffffffffffffffc8;
    iVar2 = in_stack_ffffffffffffffd0;
  }
  lVar3 = (long)iVar2;
  if (lVar3 <= (long)puVar1 - (long)__ptr >> 2) {
    iVar2 = iVar2 + 10;
    __ptr = (undefined4 *)realloc(__ptr,lVar3 * 4 + 0x28);
    puVar1 = __ptr + lVar3;
  }
  *puVar1 = 1;
  puVar1 = puVar1 + 1;
  lVar3 = (long)iVar2;
  if (lVar3 <= (long)puVar1 - (long)__ptr >> 2) {
    iVar2 = iVar2 + 10;
    __ptr = (undefined4 *)realloc(__ptr,lVar3 * 4 + 0x28);
    puVar1 = __ptr + lVar3;
  }
  *puVar1 = 2;
  puVar1 = puVar1 + 1;
  lVar3 = (long)iVar2;
  if (lVar3 <= (long)puVar1 - (long)__ptr >> 2) {
    iVar2 = iVar2 + 10;
    __ptr = (undefined4 *)realloc(__ptr,lVar3 * 4 + 0x28);
    puVar1 = __ptr + lVar3;
  }
  *puVar1 = 3;
  puVar1 = puVar1 + 1;
  lVar3 = (long)iVar2;
  if (lVar3 <= (long)puVar1 - (long)__ptr >> 2) {
    iVar2 = iVar2 + 10;
    __ptr = (undefined4 *)realloc(__ptr,lVar3 * 4 + 0x28);
    puVar1 = __ptr + lVar3;
  }
  *puVar1 = 4;
  s.top = puVar1 + 1;
  s.base = __ptr;
  s.stacksize = iVar2;
  s._20_4_ = in_stack_ffffffffffffffd4;
  PrintStackData(s);
  conversion();
  LineEdit();
  return 0;
}

Assistant:

int main(){
    SqStack S;
    S = InitStack(S);
    S = Push(S,1);
    S = Push(S,2);
    S = Push(S,3);
    S = Push(S,4);
    PrintStackData(S);
    conversion(10);
    LineEdit();
    return 0;
}